

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Uart61.cpp
# Opt level: O0

void IMU_JY61::ParseData(char chr,long time_base)

{
  undefined7 uVar1;
  long lVar2;
  ostream *poVar3;
  ulong uVar4;
  float time_dist_2;
  long time_2;
  float time_dist_1;
  long time_1;
  float time_dist;
  long time;
  time_t now;
  undefined8 uStack_20;
  uchar i;
  short sData [4];
  long time_base_local;
  char chr_local;
  
  uVar4 = (ulong)ParseData::chrCnt;
  ParseData::chrCnt = ParseData::chrCnt + '\x01';
  ParseData::chrBuf[uVar4] = chr;
  if (10 < ParseData::chrCnt) {
    sData = (short  [4])time_base;
    if ((ParseData::chrBuf[0] == 'U') && ((ParseData::chrBuf[1] & 0x50U) == 0x50)) {
      uStack_20 = CONCAT17(ParseData::chrBuf[9],
                           CONCAT16(ParseData::chrBuf[8],ParseData::chrBuf._2_6_));
      std::ios_base::precision((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),5);
      switch(ParseData::chrBuf[1]) {
      case 'Q':
        fflush(_stdout);
        setvbuf(_stdout,(char *)0x0,2,0);
        freopen("../imu_acc.mat","a",_stdout);
        lVar2 = getTimeToBase((long)sData);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(float)lVar2 * 0.0001);
        std::operator<<(poVar3," ");
        for (now._7_1_ = 0; now._7_1_ < 3; now._7_1_ = now._7_1_ + 1) {
          (&a)[now._7_1_] =
               ((float)(int)*(short *)((long)&stack0xffffffffffffffe0 + (ulong)now._7_1_ * 2) /
               32768.0) * 16.0;
        }
        printf("%6.3f %6.3f %6.3f\n",(double)a,(double)DAT_0010a228,(double)DAT_0010a22c);
        break;
      case 'R':
        fflush(_stdout);
        setvbuf(_stdout,(char *)0x0,2,0);
        freopen("../imu_gyo.mat","a",_stdout);
        lVar2 = getTimeToBase((long)sData);
        poVar3 = std::operator<<((ostream *)&std::cout,"");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,(float)lVar2 * 0.0001);
        std::operator<<(poVar3," ");
        for (now._7_1_ = 0; now._7_1_ < 3; now._7_1_ = now._7_1_ + 1) {
          (&w)[now._7_1_] =
               ((float)(int)*(short *)((long)&stack0xffffffffffffffe0 + (ulong)now._7_1_ * 2) /
               32768.0) * 2000.0;
        }
        printf("%7.3f %7.3f %7.3f\n",(double)w,(double)DAT_0010a234,(double)DAT_0010a238);
        break;
      case 'S':
        fflush(_stdout);
        setvbuf(_stdout,(char *)0x0,2,0);
        freopen("imu_angle.mat","a",_stdout);
        lVar2 = getTimeToBase((long)sData);
        std::ios_base::precision((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),5);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(float)lVar2 * 0.0001);
        std::operator<<(poVar3," ");
        for (now._7_1_ = 0; now._7_1_ < 3; now._7_1_ = now._7_1_ + 1) {
          (&Angle)[now._7_1_] =
               ((float)(int)*(short *)((long)&stack0xffffffffffffffe0 + (ulong)now._7_1_ * 2) /
               32768.0) * 180.0;
        }
        printf("%7.3f %7.3f %7.3f ",(double)Angle,(double)DAT_0010a240,(double)DAT_0010a244);
        break;
      case 'T':
        for (now._7_1_ = 0; now._7_1_ < 3; now._7_1_ = now._7_1_ + 1) {
          (&h)[now._7_1_] =
               (float)(int)*(short *)((long)&stack0xffffffffffffffe0 + (ulong)now._7_1_ * 2);
        }
        printf("h:%4.0f %4.0f %4.0f ",(double)h,(double)DAT_0010a24c,(double)DAT_0010a250);
      }
      ParseData::chrCnt = '\0';
    }
    else {
      printf("Error:%x %x\r\n",(ulong)(uint)(int)ParseData::chrBuf[0],
             (ulong)(uint)(int)ParseData::chrBuf[1]);
      uVar1 = CONCAT61(ParseData::chrBuf._2_6_,ParseData::chrBuf[1]);
      ParseData::chrBuf[0] = ParseData::chrBuf[1];
      ParseData::chrBuf[1] = (char)ParseData::chrBuf._2_6_;
      ParseData::chrBuf._2_6_ = (undefined6)(CONCAT17(ParseData::chrBuf[8],uVar1) >> 0x10);
      ParseData::chrBuf[8] = ParseData::chrBuf[9];
      ParseData::chrBuf[9] = ParseData::chrBuf[10];
      ParseData::chrCnt = ParseData::chrCnt + 0xff;
    }
  }
  return;
}

Assistant:

void ParseData(char chr,long time_base)
    {
        static char chrBuf[100];
        static unsigned char chrCnt=0;
        signed short sData[4];
        unsigned char i;

        time_t now;
        chrBuf[chrCnt++]=chr;
        if (chrCnt<11) return;

        if ((chrBuf[0]!=0x55)||((chrBuf[1]&0x50)!=0x50)) {printf("Error:%x %x\r\n",chrBuf[0],chrBuf[1]);memcpy(&chrBuf[0],&chrBuf[1],10);chrCnt--;return;}

        memcpy(&sData[0],&chrBuf[2],8);

//        fflush(stdout);
//        setvbuf(stdout,NULL,_IONBF,0);
//        freopen("../imu_data.txt","a",stdout);

       std::cout.precision(5);

        switch(chrBuf[1])
        {
            case 0x51:
            {
                fflush(stdout);
                setvbuf(stdout,NULL,_IONBF,0);
                freopen("../imu_acc.mat","a",stdout);

                long time = getTimeToBase(time_base);
                float time_dist =float(time)*0.0001;
                std::cout<<time_dist<<" ";
                for (i=0;i<3;i++)
                {
                    //src
                    a[i] = (float)sData[i]/32768.0*16.0;

                    //qxiaofan
                    //a[i] = (float)sData[i] * 16.0;
                }

                //time(&now);
                //printf("\r\nT:%s a:%6.3f %6.3f %6.3f ",asctime(localtime(&now)),a[0],a[1],a[2]);
                printf("%6.3f %6.3f %6.3f\n",a[0],a[1],a[2]);
            }
                break;
            case 0x52:
            {
                fflush(stdout);
                setvbuf(stdout,NULL,_IONBF,0);
                freopen("../imu_gyo.mat","a",stdout);
                long time = getTimeToBase(time_base);
                float time_dist =float(time)*0.0001;
                std::cout<<""<<time_dist<<" ";
                for (i=0;i<3;i++)
                {
                    //src
                    w[i] = (float)sData[i]/32768.0*2000.0;

                    //qxiaofan
                    //w[i] = (float)sData[i]*2000.0;
                }
                printf("%7.3f %7.3f %7.3f\n",w[0],w[1],w[2]);
            }

                break;
            case 0x53:
            {
                fflush(stdout);
                setvbuf(stdout,NULL,_IONBF,0);
                freopen("imu_angle.mat","a",stdout);
                long time = getTimeToBase(time_base);
                float time_dist =float(time)*0.0001;
                std::cout.precision(5);
                std::cout<<time_dist<<" ";
                for (i=0;i<3;i++)
                {
                    //src
                    Angle[i] = (float)sData[i]/32768.0*180.0;

                    //qxiaofan
                    //Angle[i] = (float)sData[i] * 180.0;
                }
                printf("%7.3f %7.3f %7.3f ",Angle[0],Angle[1],Angle[2]);

            }

                break;
            case 0x54:
                for (i=0;i<3;i++) h[i] = (float)sData[i];
                printf("h:%4.0f %4.0f %4.0f ",h[0],h[1],h[2]);

                break;
        }
        chrCnt=0;
    }